

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.cpp
# Opt level: O0

int timings<std::complex<float>>(string *filename,int test)

{
  pointer __n;
  int iVar1;
  ostream *poVar2;
  reference this;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<std::complex<float>_> local_291;
  complex<float> local_290;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> local_288;
  allocator<char> local_269;
  string local_268;
  undefined1 local_248 [8];
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> psi;
  size_t N;
  stringstream local_208 [8];
  stringstream qasm;
  ostream local_1f8 [392];
  string local_70;
  undefined1 local_50 [8];
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> circuit;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  time;
  R tol;
  int test_local;
  string *filename_local;
  
  std::numeric_limits<float>::epsilon();
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&circuit.gates_.
                   super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string((string *)&local_70,(string *)filename);
  qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::QCircuit
            ((QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *)local_50,
             &local_70,0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::stringstream::stringstream(local_208);
  qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::toQASM
            ((QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *)local_50,
             local_1f8,0);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nqasm:\n");
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<(poVar2,(string *)&N);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&N);
  iVar1 = qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::nbQubits
                    ((QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *)
                     local_50);
  psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(1L << ((byte)iVar1 & 0x3f));
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_248);
  if ((test == 1) || (test == 3)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"CPU");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"  * initialize ket0:",&local_269);
    tic(&local_268,
        (TP *)&circuit.gates_.
               super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    __n = psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage;
    std::complex<float>::complex(&local_290,0.0,0.0);
    std::allocator<std::complex<float>_>::allocator(&local_291);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
              (&local_288,(size_type)__n,&local_290,&local_291);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
              ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_248,
               &local_288);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector(&local_288);
    std::allocator<std::complex<float>_>::~allocator(&local_291);
    this = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator[]
                     ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                      local_248,0);
    std::complex<float>::operator=(this,1.0);
    toc((TP *)&circuit.gates_.
               super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"  * simulate qft circuit:",&local_2b9);
    tic(&local_2b8,
        (TP *)&circuit.gates_.
               super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::simulate
              ((QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *)local_50,
               (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_248);
    toc((TP *)&circuit.gates_.
               super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_248);
  std::__cxx11::stringstream::~stringstream(local_208);
  qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::~QCircuit
            ((QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *)local_50);
  return 0;
}

Assistant:

int timings( const std::string& filename , const int test ) {

  using R = qclab::real_t< T > ;
  const R tol = 10 * std::numeric_limits< R >::epsilon() ;

  // timing variable
  std::chrono::time_point< std::chrono::high_resolution_clock > time ;

  // quantum circuit
  qclab::QCircuit< T > circuit( filename ) ;
  std::stringstream qasm ;
  circuit.toQASM( qasm ) ;
  std::cout << "\nqasm:\n" << qasm.str() << std::endl ;

  // vector size
  const size_t N = size_t(1) << circuit.nbQubits() ;

  // simulate on CPU
  std::vector< T > psi ;
  if ( test == 1 || test == 3 ) {
    std::cout << "CPU" << std::endl ;
    // all zero state
    tic( "  * initialize ket0:" , time ) ;
    psi = std::vector< T >( N , T(0) ) ;
    psi[0] = 1 ;
    toc( time ) ;
    // simulate
    tic( "  * simulate qft circuit:" , time ) ;
    circuit.simulate( psi ) ;
    toc( time ) ;
  }

  // simulate on GPU
  if ( test == 2 || test == 3 ) {
  #ifdef QCLAB_OMP_OFFLOADING
    std::cout << "GPU" << std::endl ;
    std::vector< T > phi( N ) ; T* phi_ = phi.data() ;
    #pragma omp target enter data map(alloc:phi_[0:N])
    // all zero state
    tic( "  * initialize ket0:" , time ) ;
    #pragma omp target
    {
      phi_[0] = 1 ;
      #pragma omp parallel for
      for ( size_t i = 1; i < N; i++ ) {
        phi_[i] = 0 ;
      }
    }
    toc( time ) ;
    // simulate
    tic( "  * simulate qft circuit:" , time ) ;
    circuit.simulate_device( phi_ ) ;
    toc( time ) ;
    // check
    if ( test == 3 ) {
      #pragma omp target update from(phi_[0:N])
      #pragma omp target exit data map(delete:phi_[0:N])
      for ( size_t i = 0; i < N; i++ ) {
        if ( std::abs( psi[i] - phi[i] ) > tol ) {
          std::cout << " *** CHECK FAILED! ***" << std::endl ;
          return -1 ;
        }
      }
      std::cout << "Check passed." << std::endl ;
    }
  #endif
  }

  // successful
  return 0 ;

}